

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t save_preview(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  int iVar1;
  exr_result_t eVar2;
  void *ptr;
  long in_RSI;
  long in_RDI;
  size_t prevsize;
  uint32_t sizes [2];
  exr_result_t rv;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffec;
  
  iVar3 = **(int **)(in_RSI + 0x18);
  iVar1 = *(int *)(*(long *)(in_RSI + 0x18) + 4);
  ptr = (void *)(ulong)(uint)(iVar3 * 4 * iVar1);
  eVar2 = save_attr_sz((_internal_exr_context *)CONCAT44(in_stack_ffffffffffffffec,iVar1),
                       CONCAT44(iVar3,in_stack_ffffffffffffffe0));
  if (eVar2 == 0) {
    eVar2 = save_attr_32((_internal_exr_context *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),ptr,0);
  }
  if (eVar2 == 0) {
    eVar2 = (**(code **)(in_RDI + 0x30))
                      (in_RDI,*(undefined8 *)(*(long *)(in_RSI + 0x18) + 0x10),ptr,in_RDI + 0xb0);
  }
  return eVar2;
}

Assistant:

static exr_result_t
save_preview (struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t rv;
    uint32_t     sizes[2];
    size_t       prevsize = 0;

    sizes[0] = a->preview->width;
    sizes[1] = a->preview->height;
    prevsize = 4 * sizes[0] * sizes[1];

    rv = save_attr_sz (ctxt, sizeof (uint32_t) * 2 + prevsize);

    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, sizes, 2);
    if (rv == EXR_ERR_SUCCESS)
        rv = ctxt->do_write (
            ctxt, a->preview->rgba, prevsize, &(ctxt->output_file_offset));
    return rv;
}